

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSegment.cpp
# Opt level: O2

void __thiscall
vectorgraphics::LineSegment3D::LineSegment3D
          (LineSegment3D *this,double start_x,double start_y,double start_z,double end_x,
          double end_y,double end_z)

{
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Primitive).style_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Primitive).flag_ptrs.
  super__Vector_base<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Primitive).sub_primitive_ptrs_.
  super__Vector_base<std::shared_ptr<vectorgraphics::Primitive>,_std::allocator<std::shared_ptr<vectorgraphics::Primitive>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = end_y;
  local_30 = end_x;
  local_28 = start_z;
  local_20 = start_y;
  local_18 = start_x;
  std::make_shared<vectorgraphics::Point3D,double&,double&,double&>
            ((double *)&this->start_ptr_,&local_18,&local_20);
  std::make_shared<vectorgraphics::Point3D,double&,double&,double&>
            ((double *)&this->end_ptr_,&local_30,&local_38);
  return;
}

Assistant:

LineSegment3D::LineSegment3D(double start_x, double start_y, double start_z, double end_x, double end_y, double end_z) : 
    start_ptr_(std::make_shared<Point3D>(start_x, start_y, start_z)), 
    end_ptr_(std::make_shared<Point3D>(end_x, end_y, end_z)) {
  }